

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall QGraphicsAnchorLayoutPrivate::deleteLayoutEdges(QGraphicsAnchorLayoutPrivate *this)

{
  QGraphicsLayoutItem *pQVar1;
  Data *pDVar2;
  Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *pNVar3;
  AnchorVertex *pAVar4;
  AnchorVertex *pAVar5;
  long in_FS_OFFSET;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  local_30.second = AnchorLeft;
  pDVar2 = (this->m_vertexList).d;
  local_30.first = pQVar1;
  if (pDVar2 == (Data *)0x0) {
    pAVar5 = (AnchorVertex *)0x0;
LAB_005bf469:
    pAVar4 = (AnchorVertex *)0x0;
  }
  else {
    pNVar3 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
             ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                       ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                         *)pDVar2,&local_30);
    if (pNVar3 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                   *)0x0) {
      pAVar5 = (AnchorVertex *)0x0;
    }
    else {
      pAVar5 = (pNVar3->value).first;
    }
    pDVar2 = (this->m_vertexList).d;
    local_30.second = AnchorRight;
    local_30.first = pQVar1;
    if (pDVar2 == (Data *)0x0) goto LAB_005bf469;
    pNVar3 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
             ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                       ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                         *)pDVar2,&local_30);
    if (pNVar3 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                   *)0x0) goto LAB_005bf469;
    pAVar4 = (pNVar3->value).first;
  }
  removeAnchor_helper(this,pAVar5,pAVar4);
  local_30.second = AnchorTop;
  pDVar2 = (this->m_vertexList).d;
  if (pDVar2 == (Data *)0x0) {
    pAVar5 = (AnchorVertex *)0x0;
    local_30.first = pQVar1;
  }
  else {
    local_30.first = pQVar1;
    pNVar3 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
             ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                       ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                         *)pDVar2,&local_30);
    if (pNVar3 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                   *)0x0) {
      pAVar5 = (AnchorVertex *)0x0;
    }
    else {
      pAVar5 = (pNVar3->value).first;
    }
    pDVar2 = (this->m_vertexList).d;
    local_30.second = AnchorBottom;
    local_30.first = pQVar1;
    if (pDVar2 != (Data *)0x0) {
      pNVar3 = QHashPrivate::
               Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
               ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                         ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                           *)pDVar2,&local_30);
      if (pNVar3 != (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                     *)0x0) {
        pAVar4 = (pNVar3->value).first;
        goto LAB_005bf4dc;
      }
    }
  }
  pAVar4 = (AnchorVertex *)0x0;
LAB_005bf4dc:
  removeAnchor_helper(this,pAVar5,pAVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::deleteLayoutEdges()
{
    Q_Q(QGraphicsAnchorLayout);

    Q_ASSERT(!internalVertex(q, Qt::AnchorHorizontalCenter));
    Q_ASSERT(!internalVertex(q, Qt::AnchorVerticalCenter));

    removeAnchor_helper(internalVertex(q, Qt::AnchorLeft),
                        internalVertex(q, Qt::AnchorRight));
    removeAnchor_helper(internalVertex(q, Qt::AnchorTop),
                        internalVertex(q, Qt::AnchorBottom));
}